

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O1

ssize_t __thiscall
xray_re::xr_ini_writer::write(xr_ini_writer *this,int __fd,void *__buf,size_t __n)

{
  long *extraout_RAX;
  long *plVar1;
  allocator<char> local_41;
  long *local_40 [2];
  long local_30 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,(char *)__buf,&local_41);
  write(this,__fd,(string *)local_40,__n & 0xffffffff);
  plVar1 = local_30;
  if (local_40[0] != plVar1) {
    operator_delete(local_40[0],local_30[0] + 1);
    plVar1 = extraout_RAX;
  }
  return (ssize_t)plVar1;
}

Assistant:

void xr_ini_writer::write(const char *key, const char *value, bool enclose)
{
	write(key, std::string(value), enclose);
}